

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

TPZSkylMatrix<std::complex<double>_> * __thiscall
TPZSkylMatrix<std::complex<double>_>::operator-=
          (TPZSkylMatrix<std::complex<double>_> *this,TPZSkylMatrix<std::complex<double>_> *A)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TPZSkylMatrix<std::complex<double>_> TStack_78;
  
  iVar1 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  iVar2 = (*(A->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(A);
  if (CONCAT44(extraout_var,iVar1) != CONCAT44(extraout_var_00,iVar2)) {
    TPZMatrix<std::complex<double>_>::Error
              ("TPZSkylMatrix<TVar> &TPZSkylMatrix<std::complex<double>>::operator-=(const TPZSkylMatrix<TVar> &) [TVar = std::complex<double>]"
               ,"operator+=( TPZSkylMatrix ) <incompatible dimensions>");
  }
  operator-(&TStack_78,this,A);
  operator=(this,&TStack_78);
  ~TPZSkylMatrix(&TStack_78,&TPZSkylMatrix<std::complex<double>>::VTT);
  return this;
}

Assistant:

TPZSkylMatrix<TVar> &
TPZSkylMatrix<TVar>::operator-=(const TPZSkylMatrix<TVar> &A )
{
  if ( this->Dim() != A.Dim() )
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"operator+=( TPZSkylMatrix ) <incompatible dimensions>" );

	*this = *this - A;
	return *this;
}